

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O0

bool __thiscall absl::Mutex::LockWhenCommon(Mutex *this,Condition *cond,KernelTimeout t,bool write)

{
  bool bVar1;
  undefined1 *how_00;
  GraphId id_00;
  bool res;
  GraphId id;
  MuHow how;
  bool write_local;
  Condition *cond_local;
  Mutex *this_local;
  KernelTimeout t_local;
  
  how_00 = kSharedS;
  if (write) {
    how_00 = kExclusiveS;
  }
  id_00 = DebugOnlyDeadlockCheck(this);
  bVar1 = LockSlowWithDeadline(this,(MuHow)how_00,cond,t,0);
  DebugOnlyLockEnter(this,id_00);
  return bVar1;
}

Assistant:

bool Mutex::LockWhenCommon(const Condition& cond,
                           synchronization_internal::KernelTimeout t,
                           bool write) {
  MuHow how = write ? kExclusive : kShared;
  ABSL_TSAN_MUTEX_PRE_LOCK(this, TsanFlags(how));
  GraphId id = DebugOnlyDeadlockCheck(this);
  bool res = LockSlowWithDeadline(how, &cond, t, 0);
  DebugOnlyLockEnter(this, id);
  ABSL_TSAN_MUTEX_POST_LOCK(this, TsanFlags(how), 0);
  return res;
}